

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::ChildSet::checkExits(ChildSet *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  int osErrorNumber;
  iterator iVar3;
  pid_t pid;
  Fault f;
  int status;
  
LAB_003ee2bc:
  pid = waitpid(-1,&status,1);
  if (pid < 0) goto code_r0x003ee2d1;
  goto LAB_003ee2e5;
code_r0x003ee2d1:
  osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  if (osErrorNumber != -1) {
    if (osErrorNumber != 0) {
      if (osErrorNumber == 10) {
        return;
      }
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x113,osErrorNumber,"waitpid()","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_003ee2e5:
    if (pid == 0) {
      return;
    }
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>,_std::_Select1st<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
            ::find((_Rb_tree<int,_std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>,_std::_Select1st<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
                    *)this,&pid);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->waiters)._M_t._M_impl.super__Rb_tree_header) {
      p_Var1 = iVar3._M_node[1]._M_parent;
      p_Var2 = p_Var1->_M_left;
      if ((char)p_Var2->_M_color == _S_black) {
        *(undefined1 *)&p_Var2->_M_color = _S_red;
      }
      p_Var1 = p_Var1->_M_right;
      f.exception._0_4_ = status;
      (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,&f);
    }
  }
  goto LAB_003ee2bc;
}

Assistant:

void UnixEventPort::ChildSet::checkExits() {
  for (;;) {
    int status;
    pid_t pid;
    KJ_SYSCALL_HANDLE_ERRORS(pid = waitpid(-1, &status, WNOHANG)) {
      case ECHILD:
        return;
      default:
        KJ_FAIL_SYSCALL("waitpid()", error);
    }
    if (pid == 0) break;

    auto iter = waiters.find(pid);
    if (iter != waiters.end()) {
      iter->second->pidRef = kj::none;
      iter->second->fulfiller.fulfill(kj::cp(status));
    }
  }
}